

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

_Bool menu_calc_size(menu *menu)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  region_conflict rVar5;
  
  rVar5.col = (menu->boundary).col;
  rVar5.row = (menu->boundary).row;
  rVar5.width = (menu->boundary).width;
  rVar5.page_rows = (menu->boundary).page_rows;
  rVar5 = region_calculate(rVar5);
  (menu->active).col = rVar5.col;
  (menu->active).row = rVar5.row;
  (menu->active).width = rVar5.width;
  (menu->active).page_rows = rVar5.page_rows;
  if (menu->title != (char *)0x0) {
    piVar1 = &(menu->active).row;
    *piVar1 = *piVar1 + 2;
    piVar1 = &(menu->active).page_rows;
    *piVar1 = *piVar1 + -2;
    (menu->active).col = (menu->active).col + 4;
  }
  if (menu->header != (char *)0x0) {
    piVar1 = &(menu->active).row;
    *piVar1 = *piVar1 + 1;
    piVar1 = &(menu->active).page_rows;
    *piVar1 = *piVar1 + -1;
  }
  if (menu->prompt != (char *)0x0) {
    iVar3 = (menu->active).page_rows;
    if (iVar3 < 2) {
      sVar4 = strlen(menu->prompt);
      iVar3 = (int)sVar4 + 2;
      (menu->active).col = (menu->active).col + iVar3;
      piVar1 = &(menu->active).width;
      *piVar1 = *piVar1 - iVar3;
    }
    else {
      (menu->active).page_rows = iVar3 + -1;
    }
  }
  if ((menu->active).width < 1) {
    bVar2 = false;
  }
  else {
    bVar2 = 0 < (menu->active).page_rows;
  }
  return bVar2;
}

Assistant:

static bool menu_calc_size(struct menu *menu)
{
	/* Calculate term-relative positions */
	menu->active = region_calculate(menu->boundary);

	if (menu->title) {
		menu->active.row += 2;
		menu->active.page_rows -= 2;
		menu->active.col += 4;
	}

	if (menu->header) {
		menu->active.row++;
		menu->active.page_rows--;
	}

	if (menu->prompt) {
		if (menu->active.page_rows > 1) {
			menu->active.page_rows--;
		} else {
			int offset = strlen(menu->prompt) + 2;
			menu->active.col += offset;
			menu->active.width -= offset;
		}
	}

	return (menu->active.width > 0 && menu->active.page_rows > 0);
}